

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FromTime
          (ON_wString *this,tm *t,ON_DateFormat date_format,ON_TimeFormat time_format,
          wchar_t date_separator,wchar_t date_time_separator,wchar_t time_separator)

{
  int iVar1;
  int local_50;
  int local_4c;
  int year;
  int mon;
  int yday;
  int mday;
  wchar_t date_time_separator_local;
  wchar_t date_separator_local;
  ON_TimeFormat time_format_local;
  ON_DateFormat date_format_local;
  tm *t_local;
  
  mon = t->tm_mday;
  if ((mon < 1) || (0x1f < mon)) {
    mon = 0;
  }
  iVar1 = t->tm_yday;
  if ((iVar1 < 0) || (0x16d < iVar1)) {
    year = 0;
  }
  else {
    year = iVar1 + 1;
  }
  local_4c = t->tm_mon;
  if ((local_4c < 0) || (0xb < local_4c)) {
    local_4c = 0;
  }
  else {
    local_4c = local_4c + 1;
  }
  if (t->tm_year < 0) {
    local_50 = 0;
  }
  else {
    local_50 = t->tm_year + 0x76c;
  }
  if ((local_4c < 1) || (mon < 1)) {
    FromYearDayHourMinuteSecond
              (this,local_50,year,t->tm_hour,t->tm_min,t->tm_sec,date_format,time_format,
               date_separator,date_time_separator,time_separator);
  }
  else {
    FromYearMonthDayHourMinuteSecond
              (this,local_50,local_4c,mon,t->tm_hour,t->tm_min,t->tm_sec,date_format,time_format,
               date_separator,date_time_separator,time_separator);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromTime(
  const struct tm& t,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  int mday = t.tm_mday;
  if (mday < 1 || mday > 31)
    mday = 0;

  int yday = t.tm_yday;
  if (yday < 0 || yday > 365)
    yday = 0;
  else
    yday++;

  int mon = t.tm_mon;
  if (mon < 0 || mon > 11)
    mon = 0;
  else
    mon++;

  int year = t.tm_year;
  if (year < 0)
    year = 0;
  else
    year += 1900;

  return (mon > 0 && mday > 0)
    ? ON_wString::FromYearMonthDayHourMinuteSecond(
      year, mon, mday,
      (int)t.tm_hour, (int)t.tm_min, (int)t.tm_sec,
      date_format,
      time_format,
      date_separator,
      date_time_separator,
      time_separator
    )
    : ON_wString::FromYearDayHourMinuteSecond(
      year, yday,
      (int)t.tm_hour, (int)t.tm_min, (int)t.tm_sec,
      date_format,
      time_format,
      date_separator,
      date_time_separator,
      time_separator
    );
}